

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O0

void __thiscall
chip8::interpreter::interpreter
          (interpreter *this,path *rom_path,window *interpreter_window,beeper *beeper,
          nanoseconds tick_period)

{
  size_t __n;
  const_iterator __first;
  size_type __n_00;
  iterator __result;
  beeper *local_a0;
  code *local_98;
  undefined8 local_90;
  type local_88;
  beeper *local_70;
  code *local_68;
  undefined8 local_60;
  type local_58;
  allocator<bool> local_3d [13];
  beeper *local_30;
  beeper *beeper_local;
  window *interpreter_window_local;
  path *rom_path_local;
  interpreter *this_local;
  nanoseconds tick_period_local;
  
  this->m_is_running = true;
  this->m_interpreter_window = interpreter_window;
  local_30 = beeper;
  beeper_local = (beeper *)interpreter_window;
  interpreter_window_local = (window *)rom_path;
  rom_path_local = (path *)this;
  this_local = (interpreter *)tick_period.__r;
  display::display(&this->m_display,this->m_interpreter_window,0x40,0x20);
  (this->m_machine_tick_period).__r = (rep)this_local;
  std::vector<chip8::timer,_std::allocator<chip8::timer>_>::vector(&this->m_timers);
  registers::registers(&this->m_registers,0x200);
  __n = display::get_pixel_count(&this->m_display);
  std::allocator<bool>::allocator(local_3d);
  std::vector<bool,_std::allocator<bool>_>::vector(&this->m_video_mem,__n,local_3d);
  std::allocator<bool>::~allocator(local_3d);
  std::vector<chip8::timer,std::allocator<chip8::timer>>::
  emplace_back<unsigned_char&,std::chrono::duration<long,std::ratio<1l,1000000000l>>const&>
            ((vector<chip8::timer,std::allocator<chip8::timer>> *)&this->m_timers,
             &(this->m_registers).delay,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&constants::timer_tick_freq);
  local_68 = sdl::beeper::play;
  local_60 = 0;
  local_70 = local_30;
  std::bind<void(sdl::beeper::*)()noexcept,sdl::beeper*>
            (&local_58,(offset_in_beeper_to_subr *)&local_68,&local_70);
  local_98 = sdl::beeper::pause;
  local_90 = 0;
  local_a0 = local_30;
  std::bind<void(sdl::beeper::*)()noexcept,sdl::beeper*>
            (&local_88,(offset_in_beeper_to_subr *)&local_98,&local_a0);
  std::vector<chip8::timer,std::allocator<chip8::timer>>::
  emplace_back<unsigned_char&,std::chrono::duration<long,std::ratio<1l,1000000000l>>const&,std::_Bind<void(sdl::beeper::*(sdl::beeper*))()noexcept>,std::_Bind<void(sdl::beeper::*(sdl::beeper*))()noexcept>>
            ((vector<chip8::timer,std::allocator<chip8::timer>> *)&this->m_timers,
             &(this->m_registers).sound,
             (duration<long,_std::ratio<1L,_1000000000L>_> *)&constants::timer_tick_freq,&local_58,
             &local_88);
  __first = std::array<std::byte,_80UL>::begin((array<std::byte,_80UL> *)font::raw_data);
  __n_00 = std::array<std::byte,_80UL>::size((array<std::byte,_80UL> *)font::raw_data);
  __result = std::array<std::byte,_4096UL>::begin(&this->m_mem);
  std::copy_n<std::byte_const*,unsigned_long,std::byte*>(__first,__n_00,__result);
  load_rom_from_file((path *)interpreter_window_local,&this->m_mem);
  return;
}

Assistant:

interpreter::interpreter(const std::filesystem::path& rom_path, sdl::window& interpreter_window, sdl::beeper& beeper,
	std::chrono::nanoseconds tick_period) :
		m_is_running{true},
		m_interpreter_window{interpreter_window},
		m_display{m_interpreter_window, constants::ch8_width, constants::ch8_height},
		m_machine_tick_period{tick_period},
		m_registers{constants::code_start},
		m_video_mem(this->m_display.get_pixel_count())
{
	// Set up timers
	// Timer index 0 - delay
	// Timer index 1 - sound
	this->m_timers.emplace_back(this->m_registers.delay, constants::timer_tick_freq);
	this->m_timers.emplace_back(this->m_registers.sound, constants::timer_tick_freq,
		std::bind(&sdl::beeper::play, &beeper),
		std::bind(&sdl::beeper::pause, &beeper)
	);

	// Set up memory
	std::copy_n(chip8::font::raw_data.begin(), chip8::font::raw_data.size(), this->m_mem.begin());
	chip8::load_rom_from_file(rom_path, this->m_mem);
}